

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O1

void memory_usage_test(void)

{
  size_t sVar1;
  void *pvVar2;
  size_t sVar3;
  shared_ptr<int> x;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  sVar1 = QUtil::get_max_memory_usage();
  if (sVar1 != 0) {
    pvVar2 = operator_new__(0x2800000);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<int*,std::default_delete<int[]>,std::allocator<void>,void>(&local_10,pvVar2);
    sVar3 = QUtil::get_max_memory_usage();
    if (sVar3 <= sVar1) {
      __assert_fail("u2 > u1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0x2dc,"void memory_usage_test()");
    }
    if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10._M_pi);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"memory usage okay",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void
memory_usage_test()
{
    auto u1 = QUtil::get_max_memory_usage();
    if (u1 > 0) {
        auto x = QUtil::make_shared_array<int>(10 << 20);
        auto u2 = QUtil::get_max_memory_usage();
        assert(u2 > u1);
    }
    std::cout << "memory usage okay" << std::endl;
}